

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

uint32 Time::getTimeWithBase(uint32 base)

{
  int iVar1;
  timespec *ptVar2;
  uint64 longTimeInBase;
  uint64 fracPart;
  timespec init;
  TimeVal now;
  timespec ts;
  uint32 base_local;
  
  iVar1 = clock_gettime(1,(timespec *)&now.tv_usec);
  if (iVar1 == 0x16) {
    gettimeofday((timeval *)&init.tv_nsec,(__timezone_ptr_t)0x0);
    now.tv_usec = init.tv_nsec;
    ts.tv_sec = now.tv_sec * 1000;
  }
  ptVar2 = getInitialTimespec();
  ts.tv_sec = ptVar2->tv_nsec + ts.tv_sec;
  now.tv_usec._0_4_ = (int)ptVar2->tv_sec + (int)now.tv_usec;
  if (1000000000 < ts.tv_sec) {
    now.tv_usec._0_4_ = (int)now.tv_usec + 1;
    ts.tv_sec = ts.tv_sec + -1000000000;
  }
  return (int)now.tv_usec * base + (int)((ts.tv_sec * (ulong)base) / 1000000000);
}

Assistant:

uint32 getTimeWithBase(const uint32 base)
    {
#ifdef _WIN32
        return (uint32)getTimeWithBaseHiRes(base);
#elif defined(_LINUX)
        struct timespec ts;
        if (clock_gettime(CLOCK_MONOTONIC, &ts) == EINVAL)
        {
            TimeVal now;
            gettimeofday(&now, NULL);
            ts.tv_sec = now.tv_sec;
            ts.tv_nsec = now.tv_usec * 1000;
        }
        struct timespec init = getInitialTimespec();
        ts.tv_nsec += init.tv_nsec; ts.tv_sec += init.tv_sec;
        if (ts.tv_nsec > 1000000000) { ts.tv_sec ++; ts.tv_nsec -= 1000000000; }
        uint64 fracPart = (uint64)ts.tv_nsec * base;
        uint64 longTimeInBase = ((uint64)ts.tv_sec * base) + (uint64)(fracPart / 1000000000);
        return (uint32)longTimeInBase;
#else
        TimeVal now;
        gettimeofday(&now, NULL);

        uint64 fracPart = (uint64)now.tv_usec * base;
        uint64 longTimeInBase = ((uint64)now.tv_sec * base) + (uint64)(fracPart / 1000000); 
        return (uint32)longTimeInBase;
#endif
    }